

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::evalSubscriptMat2x4(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float local_48 [4];
  float local_38 [4];
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  
  local_38[0] = (c->coords).m_data[0];
  local_38[1] = (c->coords).m_data[1];
  local_38[2] = (c->coords).m_data[2];
  local_38[3] = (c->coords).m_data[3];
  local_48[0] = local_38[1];
  local_48[1] = local_38[2];
  local_48[2] = local_38[3];
  local_48[3] = local_38[0];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = local_48[lVar1] * 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = local_38[lVar1] + res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(c->color).m_data = res_1.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res_1.m_data._8_8_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }